

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O1

PermutationMatrix<_1,_4,_int> * __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_4,_int>_>::applyTranspositionOnTheRight
          (PermutationBase<Eigen::PermutationMatrix<_1,_4,_int>_> *this,Index i,Index j)

{
  undefined4 uVar1;
  
  if (-1 < (j | i)) {
    if ((i < *(int *)(this + 0x10)) && (j < *(int *)(this + 0x10))) {
      uVar1 = *(undefined4 *)(this + (ulong)(uint)i * 4);
      *(undefined4 *)(this + (ulong)(uint)i * 4) = *(undefined4 *)(this + (ulong)(uint)j * 4);
      *(undefined4 *)(this + (ulong)(uint)j * 4) = uVar1;
      return (PermutationMatrix<_1,_4,_int> *)this;
    }
  }
  __assert_fail("i>=0 && j>=0 && i<size() && j<size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/eigen/Eigen/src/Core/PermutationMatrix.h"
                ,0xc0,
                "Derived &Eigen::PermutationBase<Eigen::PermutationMatrix<-1, 4>>::applyTranspositionOnTheRight(Index, Index) [Derived = Eigen::PermutationMatrix<-1, 4>]"
               );
}

Assistant:

Derived& applyTranspositionOnTheRight(Index i, Index j)
    {
      eigen_assert(i>=0 && j>=0 && i<size() && j<size());
      std::swap(indices().coeffRef(i), indices().coeffRef(j));
      return derived();
    }